

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

size_t compiled_size(CompiledCommand *cmd,CodeGenerator *codegen)

{
  pointer pvVar1;
  size_t sVar2;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *a;
  pointer varg;
  size_t sVar3;
  
  pvVar1 = (cmd->args).
           super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 2;
  for (varg = (cmd->args).
              super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
              ._M_impl.super__Vector_impl_data._M_start; varg != pvVar1; varg = varg + 1) {
    sVar2 = compiled_size(varg,codegen);
    sVar3 = sVar3 + sVar2;
  }
  return sVar3;
}

Assistant:

inline size_t compiled_size(const CompiledCommand& cmd, const CodeGenerator& codegen)
{
    size_t size = sizeof(uint16_t);
    for(auto& a : cmd.args) size += ::compiled_size(a, codegen);
    return size;
}